

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void expand_vec_cmpsel(TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                      TCGv_vec c1,TCGv_vec c2,TCGv_vec v3,TCGv_vec v4,TCGCond cond)

{
  TCGv_vec pTVar1;
  _Bool _Var2;
  TCGv_vec v0_00;
  TCGArg r;
  TCGArg a;
  TCGArg b;
  TCGArg c;
  TCGv_vec x;
  TCGv_vec t;
  TCGv_vec c2_local;
  TCGv_vec c1_local;
  TCGv_vec v0_local;
  uint vece_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  pTVar1 = v3;
  v0_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  _Var2 = expand_vec_cmp_noinv(tcg_ctx,type,vece,v0_00,c1,c2,cond);
  if (_Var2) {
    v3 = v4;
    v4 = pTVar1;
  }
  r = tcgv_vec_arg(tcg_ctx,v0);
  a = tcgv_vec_arg(tcg_ctx,v4);
  b = tcgv_vec_arg(tcg_ctx,v3);
  c = tcgv_vec_arg(tcg_ctx,v0_00);
  vec_gen_4_tricore(tcg_ctx,INDEX_op_x86_vpblendvb_vec,type,vece,r,a,b,c);
  tcg_temp_free_vec(tcg_ctx,v0_00);
  return;
}

Assistant:

static void expand_vec_cmpsel(TCGContext *tcg_ctx, TCGType type, unsigned vece, TCGv_vec v0,
                              TCGv_vec c1, TCGv_vec c2,
                              TCGv_vec v3, TCGv_vec v4, TCGCond cond)
{
    TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);

    if (expand_vec_cmp_noinv(tcg_ctx, type, vece, t, c1, c2, cond)) {
        /* Invert the sense of the compare by swapping arguments.  */
        TCGv_vec x;
        x = v3, v3 = v4, v4 = x;
    }
    vec_gen_4(tcg_ctx, INDEX_op_x86_vpblendvb_vec, type, vece,
              tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, v4),
              tcgv_vec_arg(tcg_ctx, v3), tcgv_vec_arg(tcg_ctx, t));
    tcg_temp_free_vec(tcg_ctx, t);
}